

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_static.c
# Opt level: O2

char * zip_name_normalize(char *name,char *nname,size_t len)

{
  long lVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  char c;
  char extraout_DL;
  size_t len_00;
  char *pcVar5;
  long lVar6;
  
  c = (char)len;
  if (len == 0 || (nname == (char *)0x0 || name == (char *)0x0)) {
    return (char *)0x0;
  }
  do {
    do {
      pcVar5 = name + 1;
      cVar2 = *name;
      name = pcVar5;
    } while (cVar2 == '/');
  } while (cVar2 == '\\');
  lVar6 = 0;
  len_00 = 0;
  do {
    if ((cVar2 == '/') || (cVar2 == '\\')) {
      if ((len_00 != 0) &&
         (iVar3 = zip_strchr_match(nname + lVar6,len_00,c), c = extraout_DL, iVar3 == 0)) {
        lVar1 = len_00 + lVar6;
        lVar6 = lVar6 + len_00 + 1;
        nname[lVar1] = cVar2;
      }
      len_00 = 0;
    }
    else {
      if (cVar2 == '\0') {
        iVar3 = zip_strchr_match(nname + lVar6,len_00,c);
        sVar4 = 0;
        if (iVar3 == 0) {
          sVar4 = len_00;
        }
        (nname + lVar6)[sVar4] = '\0';
        return nname;
      }
      nname[len_00 + lVar6] = cVar2;
      len_00 = len_00 + 1;
    }
    cVar2 = *pcVar5;
    pcVar5 = pcVar5 + 1;
  } while( true );
}

Assistant:

static char *zip_name_normalize(char *name, char *const nname, size_t len) {
  size_t offn = 0, ncpy = 0;
  char c;

  if (name == NULL || nname == NULL || len <= 0) {
    return NULL;
  }
  // skip trailing '/'
  while (ISSLASH(*name)) {
    name++;
  }

  while ((c = *name++)) {
    if (ISSLASH(c)) {
      if (ncpy > 0 && !zip_strchr_match(&nname[offn], ncpy, '.')) {
        offn += ncpy;
        nname[offn++] = c; // append '/'
      }
      ncpy = 0;
    } else {
      nname[offn + ncpy] = c;
      if (c) {
        ncpy++;
      }
    }
  }

  if (!zip_strchr_match(&nname[offn], ncpy, '.')) {
    nname[offn + ncpy] = '\0';
  } else {
    nname[offn] = '\0';
  }

  return nname;
}